

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  bool bVar1;
  string *psVar2;
  _Map_pointer ppvVar3;
  cmGlobalGenerator *globalGenerator;
  string file;
  cmStateSnapshot snapshot;
  cmMakefile mf;
  
  globalGenerator =
       (this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (globalGenerator == (cmGlobalGenerator *)0x0) {
    file._M_dataplus._M_p = (pointer)this;
    std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&mf);
    ppvVar3 = mf.FindPackageRootPathStack.
              super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map;
    globalGenerator =
         (cmGlobalGenerator *)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
  }
  else {
    ppvVar3 = (_Map_pointer)0x0;
  }
  if (path->_M_string_length != 0) {
    cmState::Reset((cmStateSnapshot *)&mf,
                   (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    (this->CurrentSnapshot).Position.Position =
         (PositionType)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    (this->CurrentSnapshot).State =
         (cmState *)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
    snapshot.State = (this->CurrentSnapshot).State;
    snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&mf,&snapshot);
    psVar2 = GetHomeOutputDirectory_abi_cxx11_(this);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&mf,psVar2);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&mf,&snapshot);
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&mf,psVar2);
    cmStateSnapshot::SetDefaultDefinitions(&snapshot);
    cmMakefile::cmMakefile(&mf,globalGenerator,&snapshot);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath(&file,path);
      cmsys::SystemTools::ConvertToUnixSlashes(&file);
      cmMakefile::SetScriptModeFile(&mf,&file);
      cmMakefile::SetArgcArgv(&mf,args);
      std::__cxx11::string::~string((string *)&file);
    }
    bVar1 = cmsys::SystemTools::FileExists(path,true);
    if (!bVar1) {
      std::operator+(&file,"Not a file: ",path);
      cmSystemTools::Error(&file);
      std::__cxx11::string::~string((string *)&file);
    }
    bVar1 = cmMakefile::ReadListFile(&mf,path);
    if (!bVar1) {
      std::operator+(&file,"Error processing file: ",path);
      cmSystemTools::Error(&file);
      std::__cxx11::string::~string((string *)&file);
    }
    cmMakefile::~cmMakefile(&mf);
  }
  if (ppvVar3 != (_Map_pointer)0x0) {
    (*(code *)((*ppvVar3)->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish)(ppvVar3);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();

  // if a generator was not specified use a generic one
  std::unique_ptr<cmGlobalGenerator> gen;
  if (!gg) {
    gen = cm::make_unique<cmGlobalGenerator>(this);
    gg = gen.get();
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(this->GetHomeOutputDirectory());
    snapshot.GetDirectory().SetCurrentSource(this->GetHomeDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!cmSystemTools::FileExists(path, true)) {
      cmSystemTools::Error("Not a file: " + path);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
  }
}